

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.h
# Opt level: O2

size_t __thiscall
xmrig::Threads<xmrig::CpuThreads>::move
          (Threads<xmrig::CpuThreads> *this,char *profile,CpuThreads *threads)

{
  pointer pCVar1;
  pointer pCVar2;
  bool bVar3;
  size_t sVar4;
  char *local_60;
  pair<const_xmrig::String,_xmrig::CpuThreads> local_58;
  
  local_60 = profile;
  bVar3 = has(this);
  if (bVar3) {
    sVar4 = 0;
  }
  else {
    pCVar1 = (threads->m_data).
             super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar2 = (threads->m_data).
             super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = (long)pCVar1 - (long)pCVar2 >> 4;
    if (pCVar1 != pCVar2) {
      std::pair<const_xmrig::String,_xmrig::CpuThreads>::
      pair<const_char_*&,_xmrig::CpuThreads,_true>(&local_58,&local_60,threads);
      std::
      _Rb_tree<xmrig::String,std::pair<xmrig::String_const,xmrig::CpuThreads>,std::_Select1st<std::pair<xmrig::String_const,xmrig::CpuThreads>>,std::less<xmrig::String>,std::allocator<std::pair<xmrig::String_const,xmrig::CpuThreads>>>
      ::_M_insert_unique<std::pair<xmrig::String_const,xmrig::CpuThreads>>
                ((_Rb_tree<xmrig::String,std::pair<xmrig::String_const,xmrig::CpuThreads>,std::_Select1st<std::pair<xmrig::String_const,xmrig::CpuThreads>>,std::less<xmrig::String>,std::allocator<std::pair<xmrig::String_const,xmrig::CpuThreads>>>
                  *)this,&local_58);
      std::pair<const_xmrig::String,_xmrig::CpuThreads>::~pair(&local_58);
    }
  }
  return sVar4;
}

Assistant:

inline size_t move(const char *profile, T &&threads)
    {
        if (has()) {
            return 0;
        }

        const size_t count = threads.count();

        if (!threads.isEmpty()) {
            m_profiles.insert({ profile, std::move(threads) });
        }

        return count;
    }